

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreencommon.cpp
# Opt level: O1

void __thiscall
QOffscreenBackingStore::flush
          (QOffscreenBackingStore *this,QWindow *window,QRegion *region,QPoint *offset)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Entry *pEVar5;
  int iVar6;
  undefined8 uVar7;
  int extraout_var;
  int extraout_EDX;
  int iVar8;
  int extraout_var_00;
  int iVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  WId id;
  QRegion clipped;
  unsigned_long_long local_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = QImage::size();
  if (0 < (int)((ulong)uVar7 >> 0x20) && 0 < (int)uVar7) {
    uVar7 = QImage::size();
    local_58 = 0xaaaaaaaaaaaaaaaa;
    iVar6 = QWindow::geometry();
    QWindow::geometry();
    local_50 = (undefined1  [8])0x0;
    local_48 = CONCAT44(extraout_var_00 - extraout_var,extraout_EDX - iVar6);
    QRegion::QRegion((QRegion *)&local_58,local_50,0);
    uVar2 = (offset->xp).m_i;
    uVar3 = (offset->yp).m_i;
    local_50 = (undefined1  [8])CONCAT44(-uVar3,-uVar2);
    local_48 = CONCAT44(~uVar3 + (int)((ulong)uVar7 >> 0x20),~uVar2 + (int)uVar7);
    QRegion::operator&=((QRegion *)&local_58,(QRect *)local_50);
    auVar10 = QRegion::boundingRect();
    iVar6 = (offset->xp).m_i;
    iVar4 = (offset->yp).m_i;
    iVar8 = auVar10._8_4_ + iVar6;
    iVar9 = auVar10._12_4_ + iVar4;
    if ((iVar8 != auVar10._0_4_ + iVar6 + -1) || (iVar9 != iVar4 + auVar10._4_4_ + -1)) {
      local_60 = QWindow::winId();
      QHash<unsigned_long_long,QRect>::tryEmplace_impl<unsigned_long_long_const&>
                ((TryEmplaceResult *)local_50,&this->m_windowAreaHash,&local_60);
      pEVar5 = (*(Span **)((long)local_50 + 0x20))[local_48 >> 7].entries;
      bVar1 = (*(Span **)((long)local_50 + 0x20))[local_48 >> 7].offsets[(uint)local_48 & 0x7f];
      *(ulong *)(pEVar5[bVar1].storage.data + 8) =
           CONCAT44(iVar4 + auVar10._4_4_,iVar6 + auVar10._0_4_);
      *(ulong *)(pEVar5[bVar1].storage.data + 0x10) = CONCAT44(iVar9,iVar8);
      QHash<unsigned_long_long,QOffscreenBackingStore*>::tryEmplace_impl<unsigned_long_long_const&>
                ((TryEmplaceResult *)local_50,&m_backingStoreForWinIdHash,&local_60);
      *(QOffscreenBackingStore **)
       ((((*(Span **)((long)local_50 + 0x20))[local_48 >> 7].entries)->storage).data +
       (ulong)(*(Span **)((long)local_50 + 0x20))[local_48 >> 7].offsets[(uint)local_48 & 0x7f] *
       0x10 + 8) = this;
    }
    QRegion::~QRegion((QRegion *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOffscreenBackingStore::flush(QWindow *window, const QRegion &region, const QPoint &offset)
{
    Q_UNUSED(region);

    if (m_image.size().isEmpty())
        return;

    QSize imageSize = m_image.size();

    QRegion clipped = QRect(0, 0, window->width(), window->height());
    clipped &= QRect(0, 0, imageSize.width(), imageSize.height()).translated(-offset);

    QRect bounds = clipped.boundingRect().translated(offset);

    if (bounds.isNull())
        return;

    WId id = window->winId();

    m_windowAreaHash[id] = bounds;
    m_backingStoreForWinIdHash[id] = this;
}